

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

bool __thiscall
KeyPair::SignSchnorr(KeyPair *this,uint256 *hash,Span<unsigned_char> sig,uint256 *aux)

{
  _Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false> keypair;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uchar *sig64;
  long in_FS_OFFSET;
  secp256k1_xonly_pubkey pubkey_verify;
  secp256k1_xonly_pubkey sStack_78;
  long local_38;
  
  sig64 = sig.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sig.m_size != 0x40) {
    __assert_fail("sig.size() == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/key.cpp"
                  ,0x1ac,
                  "bool KeyPair::SignSchnorr(const uint256 &, Span<unsigned char>, const uint256 &) const"
                 );
  }
  keypair._M_head_impl =
       (this->m_keypair)._M_t.
       super___uniq_ptr_impl<std::array<unsigned_char,_96UL>,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::array<unsigned_char,_96UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_96UL>_>_>
       .super__Head_base<0UL,_std::array<unsigned_char,_96UL>_*,_false>._M_head_impl;
  if (keypair._M_head_impl != (array<unsigned_char,_96UL> *)0x0) {
    iVar2 = secp256k1_schnorrsig_sign32
                      (secp256k1_context_sign,sig64,(uchar *)hash,
                       (secp256k1_keypair *)keypair._M_head_impl,(uchar *)aux);
    if (iVar2 != 0) {
      iVar2 = secp256k1_keypair_xonly_pub
                        (secp256k1_context_static,&sStack_78,(int *)0x0,
                         (secp256k1_keypair *)keypair._M_head_impl);
      uVar3 = secp256k1_schnorrsig_verify
                        (secp256k1_context_static,sig64,(uchar *)hash,0x20,&sStack_78);
      if ((iVar2 != 0) && (bVar1 = true, (uVar3 & 1) != 0)) goto LAB_006b751f;
    }
    memory_cleanse(sig64,0x40);
  }
  bVar1 = false;
LAB_006b751f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool KeyPair::SignSchnorr(const uint256& hash, Span<unsigned char> sig, const uint256& aux) const
{
    assert(sig.size() == 64);
    if (!IsValid()) return false;
    auto keypair = reinterpret_cast<const secp256k1_keypair*>(m_keypair->data());
    bool ret = secp256k1_schnorrsig_sign32(secp256k1_context_sign, sig.data(), hash.data(), keypair, aux.data());
    if (ret) {
        // Additional verification step to prevent using a potentially corrupted signature
        secp256k1_xonly_pubkey pubkey_verify;
        ret = secp256k1_keypair_xonly_pub(secp256k1_context_static, &pubkey_verify, nullptr, keypair);
        ret &= secp256k1_schnorrsig_verify(secp256k1_context_static, sig.data(), hash.begin(), 32, &pubkey_verify);
    }
    if (!ret) memory_cleanse(sig.data(), sig.size());
    return ret;
}